

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int dup_typedef_check(char *type,lys_tpdf *tpdf,int size)

{
  int iVar1;
  long lVar2;
  
  if (size < 1) {
    size = 0;
  }
  lVar2 = 0;
  do {
    if ((ulong)(uint)size * 0x80 + 0x80 == lVar2 + 0x80) {
      return 0;
    }
    iVar1 = strcmp(type,*(char **)(tpdf->padding + lVar2 + -0x1d));
    lVar2 = lVar2 + 0x80;
  } while (iVar1 != 0);
  return 1;
}

Assistant:

int
dup_typedef_check(const char *type, struct lys_tpdf *tpdf, int size)
{
    int i;

    for (i = 0; i < size; i++) {
        if (!strcmp(type, tpdf[i].name)) {
            /* name collision */
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}